

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_dec.c
# Opt level: O0

int pnm_getdata(jas_stream_t *in,pnm_hdr_t *hdr,jas_image_t *image,int allow_trunc)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  jas_matrix_t *pjVar4;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint_fast32_t local_90;
  uint_fast32_t uv_2;
  int_fast32_t sv_1;
  uint_fast32_t uv_1;
  int_fast32_t sv;
  int local_68;
  int uv;
  int n;
  int c;
  int type;
  int depth;
  int_fast64_t v;
  int y;
  int x;
  jas_matrix_t *data [3];
  int fmt;
  int cmptno;
  int ret;
  int allow_trunc_local;
  jas_image_t *image_local;
  pnm_hdr_t *hdr_local;
  jas_stream_t *in_local;
  
  fmt = -1;
  data[2]._0_4_ = pnm_fmt((long)hdr->magic);
  n = pnm_type((long)hdr->magic);
  if (n == 0) {
    __assert_fail("type != PNM_TYPE_INVALID",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/pnm/pnm_dec.c"
                  ,0x16f,"int pnm_getdata(jas_stream_t *, pnm_hdr_t *, jas_image_t *, int)");
  }
  c = pnm_maxvaltodepth((long)hdr->maxval);
  _y = (jas_matrix_t *)0x0;
  data[0] = (jas_matrix_t *)0x0;
  data[1] = (jas_matrix_t *)0x0;
  for (data[2]._4_4_ = 0; (int)data[2]._4_4_ < hdr->numcmpts; data[2]._4_4_ = data[2]._4_4_ + 1) {
    pjVar4 = jas_matrix_create(1,(long)hdr->width);
    *(jas_matrix_t **)(&y + (long)(int)data[2]._4_4_ * 2) = pjVar4;
    if (pjVar4 == (jas_matrix_t *)0x0) goto LAB_0015b468;
  }
  for (v._0_4_ = 0; (int)v < hdr->height; v._0_4_ = (int)v + 1) {
    if (n == 1) {
      if ((int)data[2] == 1) {
        v._4_4_ = 0;
        while (v._4_4_ < hdr->width) {
          if ((in->flags_ & 7U) == 0) {
            if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
              iVar3 = in->cnt_ + -1;
              in->cnt_ = iVar3;
              if (iVar3 < 0) {
                local_98 = jas_stream_fillbuf(in,1);
              }
              else {
                in->rwcnt_ = in->rwcnt_ + 1;
                pbVar1 = in->ptr_;
                in->ptr_ = pbVar1 + 1;
                local_98 = (uint)*pbVar1;
              }
              local_94 = local_98;
            }
            else {
              in->flags_ = in->flags_ | 4;
              local_94 = 0xffffffff;
            }
            local_9c = local_94;
          }
          else {
            local_9c = 0xffffffff;
          }
          uv = local_9c;
          if (local_9c == 0xffffffff) goto LAB_0015b468;
          local_68 = 8;
          while( true ) {
            bVar2 = false;
            if (0 < local_68) {
              bVar2 = v._4_4_ < hdr->width;
            }
            if (!bVar2) break;
            jas_matrix_set(_y,0,(long)v._4_4_,(long)(int)(1 - (uv >> 7 & 1U)));
            uv = uv << 1;
            local_68 = local_68 + -1;
            v._4_4_ = v._4_4_ + 1;
          }
        }
      }
      else {
        for (v._4_4_ = 0; v._4_4_ < hdr->width; v._4_4_ = v._4_4_ + 1) {
          iVar3 = pnm_getbitstr(in,(int *)((long)&sv + 4));
          if (iVar3 != 0) goto LAB_0015b468;
          jas_matrix_set(_y,0,(long)v._4_4_,(long)(1 - sv._4_4_));
        }
      }
    }
    else {
      for (v._4_4_ = 0; v._4_4_ < hdr->width; v._4_4_ = v._4_4_ + 1) {
        for (data[2]._4_4_ = 0; (int)data[2]._4_4_ < hdr->numcmpts;
            data[2]._4_4_ = data[2]._4_4_ + 1) {
          if ((int)data[2] == 1) {
            if ((hdr->sgnd & 1U) == 0) {
              iVar3 = pnm_getuint(in,c,(uint_fast32_t *)&sv_1);
              if (iVar3 != 0) {
                if (allow_trunc == 0) goto LAB_0015b468;
                jas_eprintf("bad sample data\n");
                sv_1 = 0;
              }
              _type = sv_1;
            }
            else {
              iVar3 = pnm_getsint(in,c,(int_fast32_t *)&uv_1);
              if (iVar3 != 0) {
                if (allow_trunc == 0) goto LAB_0015b468;
                jas_eprintf("bad sample data\n");
                uv_1 = 0;
              }
              _type = uv_1;
            }
          }
          else if ((hdr->sgnd & 1U) == 0) {
            iVar3 = pnm_getuintstr(in,&local_90);
            if (iVar3 != 0) {
              if (allow_trunc == 0) goto LAB_0015b468;
              jas_eprintf("bad sample data\n");
              local_90 = 0;
            }
            _type = local_90;
          }
          else {
            iVar3 = pnm_getsintstr(in,(int_fast32_t *)&uv_2);
            if (iVar3 != 0) {
              if (allow_trunc == 0) goto LAB_0015b468;
              jas_eprintf("bad sample data\n");
              uv_2 = 0;
            }
            _type = uv_2;
          }
          jas_matrix_set(*(jas_matrix_t **)(&y + (long)(int)data[2]._4_4_ * 2),0,(long)v._4_4_,_type
                        );
        }
      }
    }
    for (data[2]._4_4_ = 0; (int)data[2]._4_4_ < hdr->numcmpts; data[2]._4_4_ = data[2]._4_4_ + 1) {
      iVar3 = jas_image_writecmpt(image,data[2]._4_4_,0,(long)(int)v,(long)hdr->width,1,
                                  *(jas_matrix_t **)(&y + (long)(int)data[2]._4_4_ * 2));
      if (iVar3 != 0) goto LAB_0015b468;
    }
  }
  fmt = 0;
LAB_0015b468:
  for (data[2]._4_4_ = 0; (int)data[2]._4_4_ < hdr->numcmpts; data[2]._4_4_ = data[2]._4_4_ + 1) {
    if (*(long *)(&y + (long)(int)data[2]._4_4_ * 2) != 0) {
      jas_matrix_destroy(*(jas_matrix_t **)(&y + (long)(int)data[2]._4_4_ * 2));
    }
  }
  return fmt;
}

Assistant:

static int pnm_getdata(jas_stream_t *in, pnm_hdr_t *hdr, jas_image_t *image,
  int allow_trunc)
{
	int ret;
#if 0
	int numcmpts;
#endif
	int cmptno;
	int fmt;
	jas_matrix_t *data[3];
	int x;
	int y;
	int_fast64_t v;
	int depth;
	int type;
	int c;
	int n;

	ret = -1;

#if 0
	numcmpts = jas_image_numcmpts(image);
#endif
	fmt = pnm_fmt(hdr->magic);
	type = pnm_type(hdr->magic);
	assert(type != PNM_TYPE_INVALID);
	depth = pnm_maxvaltodepth(hdr->maxval);

	data[0] = 0;
	data[1] = 0;
	data[2] = 0;
	for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
		if (!(data[cmptno] = jas_matrix_create(1, hdr->width))) {
			goto done;
		}
	}

	for (y = 0; y < hdr->height; ++y) {
		if (type == PNM_TYPE_PBM) {
			if (fmt == PNM_FMT_BIN) {
				for (x = 0; x < hdr->width;) {
					if ((c = jas_stream_getc(in)) == EOF) {
						goto done;
					}
					n = 8;
					while (n > 0 && x < hdr->width) {
						jas_matrix_set(data[0], 0, x, 1 - ((c >> 7) & 1));
						c <<= 1;
						--n;
						++x;
					}
				}
			} else {
				for (x = 0; x < hdr->width; ++x) {
					int uv;
					if (pnm_getbitstr(in, &uv)) {
						goto done;
					}
					jas_matrix_set(data[0], 0, x, 1 - uv);
				}
			}
		} else {
			for (x = 0; x < hdr->width; ++x) {
				for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
					if (fmt == PNM_FMT_BIN) {
						/* The sample data is in binary format. */
						if (hdr->sgnd) {
							/* The sample data is signed. */
							int_fast32_t sv;
							if (pnm_getsint(in, depth, &sv)) {
								if (!allow_trunc) {
									goto done;
								}
								jas_eprintf("bad sample data\n");
								sv = 0;
							}
							v = sv;
						} else {
							/* The sample data is unsigned. */
							uint_fast32_t uv;
							if (pnm_getuint(in, depth, &uv)) {
								if (!allow_trunc) {
									goto done;
								}
								jas_eprintf("bad sample data\n");
								uv = 0;
							}
							v = uv;
						}
					} else {
						/* The sample data is in text format. */
						if (hdr->sgnd) {
							/* The sample data is signed. */
							int_fast32_t sv;
							if (pnm_getsintstr(in, &sv)) {
								if (!allow_trunc) {
									goto done;
								}
								jas_eprintf("bad sample data\n");
								sv = 0;
							}
							v = sv;
						} else {
							/* The sample data is unsigned. */
							uint_fast32_t uv;
							if (pnm_getuintstr(in, &uv)) {
								if (!allow_trunc) {
									goto done;
								}
								jas_eprintf("bad sample data\n");
								uv = 0;
							}
							v = uv;
						}
					}
					jas_matrix_set(data[cmptno], 0, x, v);
				}
			}
		}
		for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
			if (jas_image_writecmpt(image, cmptno, 0, y, hdr->width, 1,
			  data[cmptno])) {
				goto done;
			}
		}
	}

	ret = 0;

done:

	for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
		if (data[cmptno]) {
			jas_matrix_destroy(data[cmptno]);
		}
	}

	return ret;
}